

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteNull(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this)

{
  char *pcVar1;
  Stack<rapidjson::CrtAllocator> *this_00;
  
  this_00 = &this->os_->stack_;
  pcVar1 = this_00->stackTop_;
  if (this_00->stackEnd_ < pcVar1 + 4) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,4);
    this_00 = &this->os_->stack_;
    pcVar1 = this_00->stackTop_;
  }
  this_00->stackTop_ = pcVar1 + 1;
  *pcVar1 = 'n';
  pcVar1 = (this->os_->stack_).stackTop_;
  (this->os_->stack_).stackTop_ = pcVar1 + 1;
  *pcVar1 = 'u';
  pcVar1 = (this->os_->stack_).stackTop_;
  (this->os_->stack_).stackTop_ = pcVar1 + 1;
  *pcVar1 = 'l';
  pcVar1 = (this->os_->stack_).stackTop_;
  (this->os_->stack_).stackTop_ = pcVar1 + 1;
  *pcVar1 = 'l';
  return true;
}

Assistant:

bool WriteNull()  {
        PutReserve(*os_, 4);
        PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 'l'); return true;
    }